

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  size_t size;
  undefined1 auVar4 [16];
  slot_type *psVar5;
  slot_type *psVar6;
  MixingHashState MVar7;
  bool bVar8;
  slot_type *psVar9;
  iterator iVar10;
  
  psVar1 = (slot_type *)a->ctrl_;
  if ((psVar1 == (slot_type *)std::__cxx11::string::_M_create || psVar1 == (slot_type *)0x0) ||
     (-1 < (char)*(code *)&psVar1->_M_len)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 != (slot_type *)std::__cxx11::string::_M_create && psVar2 != (slot_type *)0x0) &&
       ((char)*(code *)&psVar2->_M_len < '\0')) goto LAB_001125f8;
    if (psVar1 == (slot_type *)std::__cxx11::string::_M_create &&
        psVar2 == (slot_type *)std::__cxx11::string::_M_create) {
LAB_001125eb:
      return psVar1 == psVar2;
    }
    if ((psVar1 == (slot_type *)std::__cxx11::string::_M_create) ==
        (psVar2 == (slot_type *)std::__cxx11::string::_M_create)) {
      if (psVar1 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_001125eb;
      if ((psVar2 == (slot_type *)&kSooControl) == (psVar1 == (slot_type *)&kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        psVar3 = (b->field_1).slot_;
        if (psVar1 == (slot_type *)&kSooControl) {
          bVar8 = (slot_type *)a == psVar3;
        }
        else {
          psVar9 = psVar3;
          psVar5 = psVar2;
          psVar6 = (slot_type *)a;
          if (psVar2 < psVar1) {
            psVar9 = (slot_type *)a;
            psVar5 = psVar1;
            psVar6 = psVar3;
          }
          b = (iterator *)CONCAT71((int7)((ulong)psVar5 >> 8),psVar5 < psVar6);
          bVar8 = psVar6 <= psVar9 && psVar5 < psVar6;
        }
        if (bVar8) goto LAB_001125eb;
      }
      goto LAB_00112602;
    }
  }
  else {
    operator==();
LAB_001125f8:
    operator==();
  }
  operator==();
LAB_00112602:
  operator==();
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  ::AssertHashEqConsistent<std::basic_string_view<char,std::char_traits<char>>>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)a,(basic_string_view<char,_std::char_traits<char>_> *)b);
  if (((slot_type *)a)->_M_len == 1) {
    iVar10 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
             ::find_soo<std::basic_string_view<char,std::char_traits<char>>>
                       ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                         *)a,(key_arg<std::basic_string_view<char>_> *)b);
    return iVar10.ctrl_._0_1_;
  }
  if (((slot_type *)a)->_M_len == 0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string_view<char>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string_view<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string_view<char>>]"
                 );
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)a);
  size = ((basic_string_view<char,_std::char_traits<char>_> *)b)->_M_len;
  MVar7 = hash_internal::MixingHashState::combine_contiguous
                    ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                     (uchar *)((basic_string_view<char,_std::char_traits<char>_> *)b)->_M_str,size);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = MVar7.state_ + size;
  iVar10 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
           ::find_non_soo<std::basic_string_view<char,std::char_traits<char>>>
                     ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                       *)a,(key_arg<std::basic_string_view<char>_> *)b,
                      SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8) ^
                      SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0));
  return iVar10.ctrl_._0_1_;
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }